

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inverse_mglsa_digital_filter.cc
# Opt level: O2

bool __thiscall
sptk::InverseMglsaDigitalFilter::Run
          (InverseMglsaDigitalFilter *this,
          vector<double,_std::allocator<double>_> *filter_coefficients,double filter_input,
          double *filter_output,Buffer *buffer)

{
  vector<double,_std::allocator<double>_> *this_00;
  long lVar1;
  uint uVar2;
  bool bVar3;
  pointer pdVar4;
  long lVar5;
  size_type sVar6;
  size_type sVar7;
  pointer pdVar8;
  ulong uVar9;
  double *pdVar10;
  ulong uVar11;
  pointer pdVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  
  if (this->is_valid_ == true) {
    bVar3 = false;
    if ((buffer != (Buffer *)0x0) && (bVar3 = false, filter_output != (double *)0x0)) {
      pdVar4 = (filter_coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar12 = (filter_coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      sVar6 = (long)pdVar12 - (long)pdVar4 >> 3;
      sVar7 = (long)this->num_filter_order_ + 1;
      bVar3 = false;
      if (sVar6 == sVar7) {
        if (this->num_stage_ == 0) {
          this_00 = &buffer->inverse_filter_coefficients_;
          pdVar8 = (buffer->inverse_filter_coefficients_).
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((long)(buffer->inverse_filter_coefficients_).
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pdVar8 != (long)pdVar12 - (long)pdVar4
             ) {
            std::vector<double,_std::allocator<double>_>::resize
                      ((vector<double,_std::allocator<double>_> *)this_00,sVar6);
            pdVar4 = (filter_coefficients->super__Vector_base<double,_std::allocator<double>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            pdVar12 = (filter_coefficients->super__Vector_base<double,_std::allocator<double>_>).
                      _M_impl.super__Vector_impl_data._M_finish;
            pdVar8 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start;
          }
          std::
          transform<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::negate<double>>
                    (pdVar4,pdVar12,pdVar8);
          bVar3 = MlsaDigitalFilter::Run
                            (&this->mlsa_digital_filter_,
                             (vector<double,_std::allocator<double>_> *)this_00,filter_input,
                             filter_output,&buffer->mlsa_digital_filter_buffer_);
          return bVar3;
        }
        sVar6 = (size_type)(this->num_stage_ * (int)sVar7);
        if ((long)(buffer->signals_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(buffer->signals_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3 != sVar6) {
          std::vector<double,_std::allocator<double>_>::resize
                    ((vector<double,_std::allocator<double>_> *)&buffer->signals_,sVar6);
          pdVar12 = (buffer->signals_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          for (pdVar4 = (buffer->signals_).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start; pdVar4 != pdVar12;
              pdVar4 = pdVar4 + 1) {
            *pdVar4 = 0.0;
          }
          pdVar4 = (filter_coefficients->super__Vector_base<double,_std::allocator<double>_>).
                   _M_impl.super__Vector_impl_data._M_start;
        }
        dVar18 = exp(-*pdVar4);
        dVar18 = dVar18 * filter_input;
        uVar2 = this->num_filter_order_;
        lVar5 = (long)(int)uVar2;
        if (lVar5 != 0) {
          pdVar4 = (filter_coefficients->super__Vector_base<double,_std::allocator<double>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          dVar19 = 1.0 - this->alpha_ * this->alpha_;
          bVar3 = this->transposition_;
          uVar15 = 0;
          uVar16 = 0;
          if (0 < (int)uVar2) {
            uVar16 = (ulong)uVar2;
          }
          uVar9 = (ulong)(uint)this->num_stage_;
          if (this->num_stage_ < 1) {
            uVar9 = uVar15;
          }
          lVar1 = (long)(int)(uVar2 + 1) * 8;
          lVar17 = 8;
          for (uVar11 = 0; uVar11 != uVar9; uVar11 = uVar11 + 1) {
            pdVar12 = (buffer->signals_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                      .super__Vector_impl_data._M_start;
            pdVar10 = pdVar12 + uVar11 * (long)(int)(uVar2 + 1);
            dVar20 = *pdVar10;
            if ((bVar3 & 1U) == 0) {
              dVar20 = dVar20 * pdVar4[1];
              for (lVar14 = 1; uVar13 = (ulong)uVar2, lVar14 < lVar5; lVar14 = lVar14 + 1) {
                dVar21 = (*(double *)((long)pdVar12 + lVar14 * 8 + uVar15 + 8) -
                         *(double *)((long)pdVar12 + lVar14 * 8 + (uVar15 - 8))) * this->alpha_ +
                         *(double *)((long)pdVar12 + lVar14 * 8 + uVar15);
                *(double *)((long)pdVar12 + lVar14 * 8 + uVar15) = dVar21;
                dVar20 = dVar20 + dVar21 * pdVar4[lVar14 + 1];
              }
              for (; 0 < (int)uVar13; uVar13 = uVar13 - 1) {
                *(undefined8 *)((long)pdVar12 + uVar13 * 8 + uVar15) =
                     *(undefined8 *)((long)pdVar12 + uVar13 * 8 + (uVar15 - 8));
              }
              *pdVar10 = this->alpha_ * *pdVar10 + dVar18 * dVar19;
            }
            else {
              pdVar10[lVar5] = pdVar4[lVar5] * dVar18 + this->alpha_ * pdVar10[lVar5 + -1];
              for (uVar13 = (ulong)uVar2; 1 < (int)uVar13; uVar13 = uVar13 - 1) {
                *(double *)((long)pdVar12 + uVar13 * 8 + (uVar15 - 8)) =
                     pdVar4[uVar13 - 1] * dVar18 +
                     (*(double *)((long)pdVar12 + uVar13 * 8 + (uVar15 - 0x10)) -
                     *(double *)((long)pdVar12 + uVar13 * 8 + uVar15)) * this->alpha_ +
                     *(double *)((long)pdVar12 + uVar13 * 8 + (uVar15 - 8));
              }
              for (uVar13 = 0; uVar16 != uVar13; uVar13 = uVar13 + 1) {
                *(undefined8 *)((long)pdVar12 + uVar13 * 8 + lVar17 + -8) =
                     *(undefined8 *)((long)pdVar12 + uVar13 * 8 + lVar17);
              }
              dVar20 = dVar20 * dVar19;
            }
            dVar18 = dVar18 + dVar20;
            uVar15 = uVar15 + lVar1;
            lVar17 = lVar17 + lVar1;
          }
        }
        *filter_output = dVar18;
        bVar3 = true;
      }
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool InverseMglsaDigitalFilter::Run(
    const std::vector<double>& filter_coefficients, double filter_input,
    double* filter_output, InverseMglsaDigitalFilter::Buffer* buffer) const {
  // Check inputs.
  if (!is_valid_ ||
      filter_coefficients.size() !=
          static_cast<std::size_t>(num_filter_order_ + 1) ||
      NULL == filter_output || NULL == buffer) {
    return false;
  }

  // Use inverse MLSA filter.
  if (0 == num_stage_) {
    if (buffer->inverse_filter_coefficients_.size() !=
        static_cast<std::size_t>(num_filter_order_ + 1)) {
      buffer->inverse_filter_coefficients_.resize(num_filter_order_ + 1);
    }
    std::transform(filter_coefficients.begin(), filter_coefficients.end(),
                   buffer->inverse_filter_coefficients_.begin(),
                   std::negate<double>());
    return mlsa_digital_filter_.Run(buffer->inverse_filter_coefficients_,
                                    filter_input, filter_output,
                                    &buffer->mlsa_digital_filter_buffer_);
  }

  // Prepare memories.
  if (buffer->signals_.size() !=
      static_cast<std::size_t>((num_filter_order_ + 1) * num_stage_)) {
    buffer->signals_.resize((num_filter_order_ + 1) * num_stage_);
    std::fill(buffer->signals_.begin(), buffer->signals_.end(), 0.0);
  }

  const double gained_input(filter_input * std::exp(-filter_coefficients[0]));
  if (0 == num_filter_order_) {
    *filter_output = gained_input;
    return true;
  }

  const double* b(&(filter_coefficients[1]));
  const double beta(1.0 - alpha_ * alpha_);
  double x(gained_input);

  for (int i(0); i < num_stage_; ++i) {
    double* d(&buffer->signals_[(num_filter_order_ + 1) * i]);
    if (transposition_) {
      const double y(x + beta * d[0]);
      d[num_filter_order_] =
          b[num_filter_order_ - 1] * x + alpha_ * d[num_filter_order_ - 1];
      for (int j(num_filter_order_ - 1); 0 < j; --j) {
        d[j] += b[j - 1] * x + alpha_ * (d[j - 1] - d[j + 1]);
      }

      for (int j(0); j < num_filter_order_; ++j) {
        d[j] = d[j + 1];
      }

      x = y;
    } else {
      double y(d[0] * b[0]);
      for (int j(1); j < num_filter_order_; ++j) {
        d[j] += alpha_ * (d[j + 1] - d[j - 1]);
        y += d[j] * b[j];
      }
      y += x;

      for (int j(num_filter_order_); 0 < j; --j) {
        d[j] = d[j - 1];
      }
      d[0] = alpha_ * d[0] + beta * x;

      x = y;
    }
  }

  *filter_output = x;

  return true;
}